

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O0

quath tinyusdz::lerp<tinyusdz::value::quath>(quath *a,quath *b,double t)

{
  quatf *a_00;
  quath qVar1;
  half hVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  float fVar6;
  undefined1 local_68 [8];
  quatf ret;
  undefined1 local_48 [8];
  quatf bf;
  quatf af;
  double t_local;
  quath *b_local;
  quath *a_local;
  quath h;
  
  value::half_to_float((half)(a->real).value);
  pvVar3 = std::array<tinyusdz::value::half,_3UL>::operator[](&a->imag,0);
  fVar6 = value::half_to_float((half)pvVar3->value);
  a_00 = (quatf *)(bf.imag._M_elems + 2);
  pvVar4 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)a_00,0);
  *pvVar4 = fVar6;
  pvVar3 = std::array<tinyusdz::value::half,_3UL>::operator[](&a->imag,1);
  fVar6 = value::half_to_float((half)pvVar3->value);
  pvVar4 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)a_00,1);
  *pvVar4 = fVar6;
  pvVar3 = std::array<tinyusdz::value::half,_3UL>::operator[](&a->imag,2);
  fVar6 = value::half_to_float((half)pvVar3->value);
  pvVar4 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)a_00,2);
  *pvVar4 = fVar6;
  ret.real._2_2_ = (b->real).value;
  bf.imag._M_elems[1] = value::half_to_float(ret.real._2_2_);
  pvVar3 = std::array<tinyusdz::value::half,_3UL>::operator[](&b->imag,0);
  ret.real._0_2_ = pvVar3->value;
  fVar6 = value::half_to_float(ret.real._0_2_);
  pvVar4 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_48,0);
  *pvVar4 = fVar6;
  pvVar3 = std::array<tinyusdz::value::half,_3UL>::operator[](&b->imag,1);
  ret.imag._M_elems[2]._2_2_ = pvVar3->value;
  fVar6 = value::half_to_float(ret.imag._M_elems[2]._2_2_);
  pvVar4 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_48,1);
  *pvVar4 = fVar6;
  pvVar3 = std::array<tinyusdz::value::half,_3UL>::operator[](&b->imag,2);
  ret.imag._M_elems[2]._0_2_ = pvVar3->value;
  fVar6 = value::half_to_float(ret.imag._M_elems[2]._0_2_);
  pvVar4 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_48,2);
  *pvVar4 = fVar6;
  _local_68 = slerp(a_00,(quatf *)local_48,(float)t);
  a_local._6_2_ = value::float_to_half_full(ret.imag._M_elems[1]);
  pvVar4 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_68,0);
  hVar2 = value::float_to_half_full(*pvVar4);
  pvVar5 = std::array<tinyusdz::value::half,_3UL>::operator[]
                     ((array<tinyusdz::value::half,_3UL> *)&a_local,0);
  pvVar5->value = hVar2.value;
  pvVar4 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_68,1);
  hVar2 = value::float_to_half_full(*pvVar4);
  pvVar5 = std::array<tinyusdz::value::half,_3UL>::operator[]
                     ((array<tinyusdz::value::half,_3UL> *)&a_local,1);
  pvVar5->value = hVar2.value;
  pvVar4 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_68,2);
  hVar2 = value::float_to_half_full(*pvVar4);
  pvVar5 = std::array<tinyusdz::value::half,_3UL>::operator[]
                     ((array<tinyusdz::value::half,_3UL> *)&a_local,2);
  pvVar5->value = hVar2.value;
  qVar1.real.value = a_local._6_2_;
  qVar1.imag._M_elems[0].value = a_local._0_2_;
  qVar1.imag._M_elems[1].value = a_local._2_2_;
  qVar1.imag._M_elems[2].value = a_local._4_2_;
  return qVar1;
}

Assistant:

inline value::quath lerp(const value::quath &a, const value::quath &b, const double t) {
  // to float.
  value::quatf af;
  value::quatf bf;
  af.real = half_to_float(a.real);
  af.imag[0] = half_to_float(a.imag[0]);
  af.imag[1] = half_to_float(a.imag[1]);
  af.imag[2] = half_to_float(a.imag[2]);

  bf.real = half_to_float(b.real);
  bf.imag[0] = half_to_float(b.imag[0]);
  bf.imag[1] = half_to_float(b.imag[1]);
  bf.imag[2] = half_to_float(b.imag[2]);

  value::quatf ret =  slerp(af, bf, float(t));
  value::quath h;
  h.real = value::float_to_half_full(ret.real);
  h.imag[0] = value::float_to_half_full(ret.imag[0]);
  h.imag[1] = value::float_to_half_full(ret.imag[1]);
  h.imag[2] = value::float_to_half_full(ret.imag[2]);

  return h;
}